

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O1

void rtext_key(_rtext *x,int keynum,t_symbol *keysym)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  size_t oldsize;
  uint32_t ch;
  size_t __n;
  int h;
  int w;
  int indx;
  int local_34 [3];
  
  local_34[1] = 0;
  local_34[0] = 0;
  if (keynum == 0) {
    pcVar6 = keysym->s_name;
    iVar10 = strcmp(pcVar6,"Home");
    if (iVar10 == 0) {
      iVar10 = x->x_selstart;
      x->x_selstart = 0;
      if (x->x_selend == iVar10) {
        x->x_selend = 0;
      }
      goto LAB_00154679;
    }
    iVar10 = strcmp(pcVar6,"End");
    if (iVar10 == 0) {
      uVar5 = x->x_bufsize;
      if (x->x_selend == x->x_selstart) {
        x->x_selstart = uVar5;
      }
    }
    else {
      iVar10 = strcmp(pcVar6,"Right");
      if (iVar10 == 0) {
        if ((x->x_selend != x->x_selstart) || (x->x_bufsize <= x->x_selstart)) {
          x->x_selstart = x->x_selend;
          goto LAB_00154679;
        }
        u8_inc(x->x_buf,&x->x_selstart);
LAB_0015464b:
        uVar5 = x->x_selstart;
      }
      else {
        iVar10 = strcmp(pcVar6,"Left");
        if (iVar10 == 0) {
          uVar5 = x->x_selstart;
          if (0 < (int)uVar5 && x->x_selend == uVar5) {
            u8_dec(x->x_buf,&x->x_selstart);
            goto LAB_0015464b;
          }
        }
        else {
          iVar10 = strcmp(pcVar6,"Up");
          if (iVar10 != 0) {
            iVar10 = strcmp(pcVar6,"Down");
            if (iVar10 == 0) {
              iVar10 = x->x_selend;
              bVar2 = iVar10 < x->x_bufsize;
              if (iVar10 < x->x_bufsize) {
                do {
                  if (x->x_buf[iVar10] == '\n') {
                    if (bVar2) {
                      u8_inc(x->x_buf,&x->x_selend);
                    }
                    break;
                  }
                  u8_inc(x->x_buf,&x->x_selend);
                  iVar10 = x->x_selend;
                  bVar2 = iVar10 < x->x_bufsize;
                } while (iVar10 < x->x_bufsize);
              }
              x->x_selstart = x->x_selend;
            }
            goto LAB_00154679;
          }
          if (x->x_selstart == 0) goto LAB_001546ab;
          pcVar6 = x->x_buf;
          do {
            u8_dec(pcVar6,&x->x_selstart);
LAB_001546ab:
            uVar5 = x->x_selstart;
          } while ((0 < (int)uVar5) && (pcVar6 = x->x_buf, pcVar6[uVar5] != '\n'));
        }
      }
    }
    x->x_selend = uVar5;
    goto LAB_00154679;
  }
  if ((keynum == 10) && ((~x->x_text->field_0x2e & 3) == 0)) {
    gatom_key(x->x_text,keysym,10.0);
    return;
  }
  ch = 10;
  if (keynum != 0xd) {
    ch = keynum;
  }
  if (keynum == 0x7f) {
    if ((x->x_selend < x->x_bufsize) && (x->x_selstart == x->x_selend)) {
      u8_inc(x->x_buf,&x->x_selend);
    }
  }
  else if (((keynum == 8) && (x->x_selstart != 0)) && (x->x_selstart == x->x_selend)) {
    u8_dec(x->x_buf,&x->x_selstart);
  }
  iVar10 = x->x_selend;
  lVar7 = (long)iVar10;
  iVar3 = x->x_selstart;
  lVar8 = (long)iVar3;
  iVar4 = x->x_bufsize;
  if (iVar10 < iVar4) {
    do {
      x->x_buf[lVar8] = x->x_buf[lVar7];
      lVar7 = lVar7 + 1;
      iVar4 = x->x_bufsize;
      lVar8 = lVar8 + 1;
    } while (lVar7 < iVar4);
  }
  iVar10 = iVar4 - (iVar10 - iVar3);
  oldsize = (size_t)iVar10;
  sVar9 = oldsize + 1;
  pcVar6 = (char *)resizebytes(x->x_buf,(long)iVar4,sVar9);
  x->x_buf = pcVar6;
  pcVar6[oldsize] = '\0';
  x->x_bufsize = iVar10;
  if (ch == 10 || ch - 0x20 < 0x5f) {
    pcVar6 = (char *)resizebytes(x->x_buf,oldsize,(long)(iVar10 + 2));
    x->x_buf = pcVar6;
    lVar7 = (long)x->x_bufsize;
    iVar10 = x->x_selstart;
    if (iVar10 < x->x_bufsize) {
      do {
        x->x_buf[lVar7] = x->x_buf[lVar7 + -1];
        lVar7 = lVar7 + -1;
        iVar10 = x->x_selstart;
      } while (iVar10 < lVar7);
    }
    x->x_buf[iVar10] = (char)ch;
    x->x_buf[sVar9] = '\0';
    x->x_bufsize = (int)sVar9;
    iVar3 = 1;
LAB_001545de:
    x->x_selstart = x->x_selstart + iVar3;
  }
  else if (0x7f < (int)ch) {
    iVar3 = u8_wc_nbytes(ch);
    sVar9 = (size_t)x->x_bufsize;
    __n = (size_t)iVar3;
    pcVar6 = (char *)resizebytes(x->x_buf,sVar9,sVar9 + __n + 1);
    x->x_buf = pcVar6;
    iVar10 = (int)(sVar9 + __n);
    iVar4 = iVar10 + -1;
    if (x->x_selstart < iVar4) {
      lVar7 = (long)iVar4;
      do {
        x->x_buf[lVar7] = x->x_buf[lVar7 - __n];
        lVar7 = lVar7 + -1;
      } while (x->x_selstart < lVar7);
    }
    x->x_buf[sVar9 + __n] = '\0';
    x->x_bufsize = iVar10;
    strncpy(x->x_buf + x->x_selstart,keysym->s_name,__n);
    goto LAB_001545de;
  }
  x->x_selend = x->x_selstart;
  puVar1 = &x->x_glist->gl_editor->field_0x88;
  *puVar1 = *puVar1 | 0x10;
LAB_00154679:
  rtext_senditup(x,2,local_34 + 1,local_34,local_34 + 2);
  return;
}

Assistant:

void rtext_key(t_rtext *x, int keynum, t_symbol *keysym)
{
    int w = 0, h = 0, indx, i, newsize, ndel;
    char *s1, *s2;
        /* CR to atom boxes sends message and resets */
    if (keynum == '\n' && x->x_text->te_type == T_ATOM)
    {
        gatom_key(x->x_text, keysym, keynum);
        return;
    }
    if (keynum)
    {
        int n = keynum;
        if (n == '\r') n = '\n';
        if (n == '\b')  /* backspace */
        {
                    /* LATER delete the box if all text is selected...
                    this causes reentrancy problems now. */
            /* if ((!x->x_selstart) && (x->x_selend == x->x_bufsize))
            {
                ....
            } */
            if (x->x_selstart && (x->x_selstart == x->x_selend))
                u8_dec(x->x_buf, &x->x_selstart);
        }
        else if (n == 127)      /* delete */
        {
            if (x->x_selend < x->x_bufsize && (x->x_selstart == x->x_selend))
                u8_inc(x->x_buf, &x->x_selend);
        }

        ndel = x->x_selend - x->x_selstart;
        for (i = x->x_selend; i < x->x_bufsize; i++)
            x->x_buf[i- ndel] = x->x_buf[i];
        newsize = x->x_bufsize - ndel;
            /* allocate extra space for hidden null terminator */
        x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
        x->x_buf[newsize] = 0;
        x->x_bufsize = newsize;

/* at Guenter's suggestion, use 'n>31' to test whether a character might
be printable in whatever 8-bit character set we find ourselves. */

/*-- moo:
  ... but test with "<" rather than "!=" in order to accommodate unicode
  codepoints for n (which we get since Tk is sending the "%A" substitution
  for bind <Key>), effectively reducing the coverage of this clause to 7
  bits.  Case n>127 is covered by the next clause.
*/
        if (n == '\n' || (n > 31 && n < 127))
        {
            newsize = x->x_bufsize+1;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
            for (i = x->x_bufsize; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-1];
            x->x_buf[x->x_selstart] = n;
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            x->x_selstart = x->x_selstart + 1;
        }
        /*--moo: check for unicode codepoints beyond 7-bit ASCII --*/
        else if (n > 127)
        {
            int ch_nbytes = u8_wc_nbytes(n);
            newsize = x->x_bufsize + ch_nbytes;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);

            for (i = newsize-1; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-ch_nbytes];
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            /*-- moo: assume canvas_key() has encoded keysym as UTF-8 */
            strncpy(x->x_buf+x->x_selstart, keysym->s_name, ch_nbytes);
            x->x_selstart = x->x_selstart + ch_nbytes;
        }
        x->x_selend = x->x_selstart;
        x->x_glist->gl_editor->e_textdirty = 1;
    }
    else if (!strcmp(keysym->s_name, "Home"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = 0;
        }
        else
            x->x_selstart = 0;
    }
    else if (!strcmp(keysym->s_name, "End"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = x->x_bufsize;
        }
        else
            x->x_selend = x->x_bufsize;
    }
    else if (!strcmp(keysym->s_name, "Right"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart < x->x_bufsize)
        {
            u8_inc(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selstart = x->x_selend;
    }
    else if (!strcmp(keysym->s_name, "Left"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart > 0)
        {
            u8_dec(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selend = x->x_selstart;
    }
        /* this should be improved...  life's too short */
    else if (!strcmp(keysym->s_name, "Up"))
    {
        if (x->x_selstart)
            u8_dec(x->x_buf, &x->x_selstart);
        while (x->x_selstart > 0 && x->x_buf[x->x_selstart] != '\n')
            u8_dec(x->x_buf, &x->x_selstart);
        x->x_selend = x->x_selstart;
    }
    else if (!strcmp(keysym->s_name, "Down"))
    {
        while (x->x_selend < x->x_bufsize &&
            x->x_buf[x->x_selend] != '\n')
            u8_inc(x->x_buf, &x->x_selend);
        if (x->x_selend < x->x_bufsize)
            u8_inc(x->x_buf, &x->x_selend);
        x->x_selstart = x->x_selend;
    }
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}